

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

void fake_a_rnd(int min,int max,int column)

{
  undefined4 in_EDX;
  long itcount;
  long len;
  long in_stack_ffffffffffffffd8;
  long in_stack_ffffffffffffffe0;
  long *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  dss_random((long *)CONCAT44(in_EDX,in_stack_fffffffffffffff0),(long)in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  NthElement(CONCAT44(in_EDX,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void
fake_a_rnd(int min, int max, int column)
{
   long len, itcount;
   RANDOM(len, (long)min, (long)max, (long)column);
   if (len % 5L == 0)
      itcount = len/5;
   else itcount = len/5 + 1L;
   NthElement(itcount, &Seed[column].usage);
   return;
}